

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

QueueDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::QueueDimensionSpecifierSyntax,slang::parsing::Token&,slang::syntax::ColonExpressionClauseSyntax*&>
          (BumpAllocator *this,Token *args,ColonExpressionClauseSyntax **args_1)

{
  ColonExpressionClauseSyntax *pCVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  QueueDimensionSpecifierSyntax *pQVar7;
  
  pQVar7 = (QueueDimensionSpecifierSyntax *)allocate(this,0x30,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pCVar1 = *args_1;
  (pQVar7->super_DimensionSpecifierSyntax).super_SyntaxNode.kind = QueueDimensionSpecifier;
  (pQVar7->super_DimensionSpecifierSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pQVar7->super_DimensionSpecifierSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pQVar7->dollar).kind = TVar3;
  (pQVar7->dollar).field_0x2 = uVar4;
  (pQVar7->dollar).numFlags = (NumericTokenFlags)NVar5.raw;
  (pQVar7->dollar).rawLen = uVar6;
  (pQVar7->dollar).info = pIVar2;
  pQVar7->maxSizeClause = pCVar1;
  if (pCVar1 != (ColonExpressionClauseSyntax *)0x0) {
    (pCVar1->super_SyntaxNode).parent = (SyntaxNode *)pQVar7;
  }
  return pQVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }